

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void idct64x64_low16_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  int iVar1;
  int in_ECX;
  uint in_EDX;
  long in_RDI;
  int in_R8D;
  __m128i *palVar2;
  __m128i *palVar3;
  __m128i *palVar4;
  __m128i *out1;
  longlong extraout_XMM0_Qa;
  longlong extraout_XMM0_Qa_00;
  longlong extraout_XMM0_Qa_01;
  longlong extraout_XMM0_Qa_02;
  longlong extraout_XMM0_Qa_03;
  longlong extraout_XMM0_Qa_04;
  longlong extraout_XMM0_Qa_05;
  longlong extraout_XMM0_Qa_06;
  longlong extraout_XMM0_Qa_07;
  longlong extraout_XMM0_Qa_08;
  longlong extraout_XMM0_Qa_09;
  longlong extraout_XMM0_Qa_10;
  longlong extraout_XMM0_Qa_11;
  longlong extraout_XMM0_Qa_12;
  longlong extraout_XMM0_Qa_13;
  longlong extraout_XMM0_Qa_14;
  longlong extraout_XMM0_Qa_15;
  longlong extraout_XMM0_Qa_16;
  longlong extraout_XMM0_Qa_17;
  longlong extraout_XMM0_Qa_18;
  longlong extraout_XMM0_Qa_19;
  longlong extraout_XMM0_Qa_20;
  longlong extraout_XMM0_Qa_21;
  longlong extraout_XMM0_Qa_22;
  longlong extraout_XMM0_Qa_23;
  longlong extraout_XMM0_Qa_24;
  longlong extraout_XMM0_Qa_25;
  longlong extraout_XMM0_Qa_26;
  longlong extraout_XMM0_Qa_27;
  longlong extraout_XMM0_Qa_28;
  __m128i *extraout_XMM0_Qa_29;
  __m128i *extraout_XMM0_Qa_30;
  __m128i *extraout_XMM0_Qa_31;
  __m128i *extraout_XMM0_Qa_32;
  __m128i *extraout_XMM0_Qa_33;
  longlong extraout_XMM0_Qb;
  longlong extraout_XMM0_Qb_00;
  longlong extraout_XMM0_Qb_01;
  longlong extraout_XMM0_Qb_02;
  longlong extraout_XMM0_Qb_03;
  longlong extraout_XMM0_Qb_04;
  longlong extraout_XMM0_Qb_05;
  longlong extraout_XMM0_Qb_06;
  longlong extraout_XMM0_Qb_07;
  longlong extraout_XMM0_Qb_08;
  longlong extraout_XMM0_Qb_09;
  longlong extraout_XMM0_Qb_10;
  longlong extraout_XMM0_Qb_11;
  longlong extraout_XMM0_Qb_12;
  longlong extraout_XMM0_Qb_13;
  longlong extraout_XMM0_Qb_14;
  longlong extraout_XMM0_Qb_15;
  longlong extraout_XMM0_Qb_16;
  longlong extraout_XMM0_Qb_17;
  longlong extraout_XMM0_Qb_18;
  longlong extraout_XMM0_Qb_19;
  longlong extraout_XMM0_Qb_20;
  longlong extraout_XMM0_Qb_21;
  longlong extraout_XMM0_Qb_22;
  longlong extraout_XMM0_Qb_23;
  longlong extraout_XMM0_Qb_24;
  longlong extraout_XMM0_Qb_25;
  longlong extraout_XMM0_Qb_26;
  longlong extraout_XMM0_Qb_27;
  __m128i *extraout_XMM0_Qb_28;
  __m128i *extraout_XMM0_Qb_29;
  __m128i *extraout_XMM0_Qb_30;
  __m128i *extraout_XMM0_Qb_31;
  __m128i *extraout_XMM0_Qb_32;
  __m128i *extraout_XMM0_Qb_33;
  __m128i *extraout_XMM0_Qb_34;
  __m128i in1;
  __m128i in1_00;
  __m128i in1_01;
  __m128i in1_02;
  __m128i in1_03;
  __m128i in1_04;
  __m128i in1_05;
  __m128i in1_06;
  __m128i in1_07;
  __m128i in1_08;
  __m128i in1_09;
  __m128i in1_10;
  __m128i in1_11;
  __m128i in1_12;
  __m128i in1_13;
  __m128i in0;
  __m128i in0_00;
  __m128i in0_01;
  __m128i in0_02;
  __m128i in0_03;
  __m128i in0_04;
  __m128i in0_05;
  __m128i in0_06;
  __m128i in0_07;
  __m128i in0_08;
  __m128i in0_09;
  __m128i in0_10;
  __m128i in0_11;
  __m128i in0_12;
  __m128i in0_13;
  __m128i tmp4;
  __m128i tmp3;
  __m128i tmp2;
  __m128i tmp1;
  __m128i u [64];
  __m128i cospim61;
  __m128i cospim60;
  __m128i cospim58;
  __m128i cospim57;
  __m128i cospim56;
  __m128i cospim53;
  __m128i cospim52;
  __m128i cospim50;
  __m128i cospim49;
  __m128i cospim48;
  __m128i cospim44;
  __m128i cospim40;
  __m128i cospim36;
  __m128i cospim32;
  __m128i cospim28;
  __m128i cospim24;
  __m128i cospim20;
  __m128i cospim16;
  __m128i cospim12;
  __m128i cospim8;
  __m128i cospim4;
  __m128i cospi63;
  __m128i cospi62;
  __m128i cospi60;
  __m128i cospi59;
  __m128i cospi56;
  __m128i cospi55;
  __m128i cospi54;
  __m128i cospi52;
  __m128i cospi51;
  __m128i cospi48;
  __m128i cospi44;
  __m128i cospi40;
  __m128i cospi36;
  __m128i cospi32;
  __m128i cospi28;
  __m128i cospi24;
  __m128i cospi20;
  __m128i cospi16;
  __m128i cospi15;
  __m128i cospi14;
  __m128i cospi13;
  __m128i cospi12;
  __m128i cospi11;
  __m128i cospi10;
  __m128i cospi9;
  __m128i cospi8;
  __m128i cospi7;
  __m128i cospi6;
  __m128i cospi5;
  __m128i cospi4;
  __m128i cospi3;
  __m128i cospi2;
  __m128i cospi1;
  __m128i clamp_hi;
  __m128i clamp_lo;
  int log_range;
  __m128i rnding;
  int32_t *cospi;
  int j;
  int i;
  __m128i *in_stack_ffffffffffffef98;
  __m128i *in_stack_ffffffffffffefa0;
  int local_103c;
  __m128i *cospi16_00;
  __m128i *cospi48_00;
  __m128i *cospim16_00;
  __m128i *cospi32_00;
  __m128i *cospim32_00;
  __m128i *cospim48_00;
  __m128i *u_00;
  __m128i *clamp_lo_00;
  int bit_00;
  __m128i *clamp_hi_00;
  __m128i *rnding_00;
  __m128i *palVar5;
  longlong local_fb8;
  __m128i *clamp_hi_01;
  longlong local_fa8 [2];
  longlong local_f98;
  longlong lStack_f90;
  longlong local_f88;
  longlong lStack_f80;
  longlong local_f78;
  longlong lStack_f70;
  longlong local_f68;
  longlong lStack_f60;
  longlong local_f58;
  longlong lStack_f50;
  longlong local_f48;
  longlong lStack_f40;
  longlong local_f38;
  longlong lStack_f30;
  longlong local_f28;
  longlong lStack_f20;
  longlong local_f18;
  longlong lStack_f10;
  longlong local_f08;
  longlong lStack_f00;
  longlong local_ef8;
  longlong lStack_ef0;
  longlong local_ee8;
  longlong lStack_ee0;
  longlong local_ed8;
  longlong lStack_ed0;
  longlong local_ec8;
  longlong lStack_ec0;
  longlong local_eb8;
  longlong lStack_eb0;
  longlong local_ea8;
  longlong lStack_ea0;
  longlong local_e98;
  longlong lStack_e90;
  longlong local_e88;
  longlong lStack_e80;
  longlong local_e78;
  longlong lStack_e70;
  longlong local_e68;
  longlong lStack_e60;
  longlong local_e58;
  longlong lStack_e50;
  longlong local_e48;
  longlong lStack_e40;
  longlong local_e38;
  longlong lStack_e30;
  longlong local_e28;
  longlong lStack_e20;
  longlong local_e18;
  longlong lStack_e10;
  longlong local_e08;
  longlong lStack_e00;
  longlong local_df8;
  longlong lStack_df0;
  longlong local_de8;
  longlong lStack_de0;
  longlong local_dd8;
  longlong lStack_dd0;
  longlong local_dc8;
  longlong lStack_dc0;
  longlong local_db8;
  longlong lStack_db0;
  longlong local_da8;
  longlong lStack_da0;
  longlong local_d98;
  longlong lStack_d90;
  longlong local_d88;
  longlong lStack_d80;
  longlong local_d78;
  longlong lStack_d70;
  longlong local_d68;
  longlong lStack_d60;
  longlong local_d58;
  longlong lStack_d50;
  longlong local_d48;
  longlong lStack_d40;
  longlong local_d38;
  longlong lStack_d30;
  longlong local_d28;
  longlong lStack_d20;
  longlong local_d18;
  longlong lStack_d10;
  longlong local_d08;
  longlong lStack_d00;
  longlong local_cf8;
  longlong lStack_cf0;
  longlong local_ce8;
  longlong lStack_ce0;
  longlong local_cd8;
  longlong lStack_cd0;
  longlong local_cc8;
  longlong lStack_cc0;
  longlong local_cb8;
  longlong lStack_cb0;
  longlong local_ca8;
  longlong lStack_ca0;
  longlong local_c98;
  longlong lStack_c90;
  longlong local_c88;
  longlong lStack_c80;
  longlong local_c78;
  longlong lStack_c70;
  longlong local_c68;
  longlong lStack_c60;
  longlong local_c58;
  longlong lStack_c50;
  longlong local_c48;
  longlong lStack_c40;
  longlong local_c38;
  longlong lStack_c30;
  longlong local_c28;
  longlong lStack_c20;
  longlong local_c18;
  longlong lStack_c10;
  longlong local_c08;
  longlong lStack_c00;
  longlong local_bf8;
  longlong lStack_bf0;
  longlong local_be8;
  longlong lStack_be0;
  longlong local_bd8;
  longlong lStack_bd0;
  longlong local_bc8;
  longlong lStack_bc0;
  longlong local_bb8;
  longlong lStack_bb0;
  longlong local_ba8;
  longlong lStack_ba0;
  longlong local_b98;
  longlong lStack_b90;
  longlong local_b88;
  longlong lStack_b80;
  longlong local_b78;
  longlong lStack_b70;
  longlong local_b68;
  longlong lStack_b60;
  longlong local_b58;
  longlong lStack_b50;
  longlong local_b48;
  longlong lStack_b40;
  longlong local_b38;
  longlong lStack_b30;
  longlong local_b28;
  longlong lStack_b20;
  longlong local_b18;
  longlong lStack_b10;
  longlong local_b08;
  longlong lStack_b00;
  longlong local_af8;
  longlong lStack_af0;
  longlong local_ae8;
  longlong lStack_ae0;
  longlong local_ad8;
  longlong lStack_ad0;
  longlong local_ac8;
  longlong lStack_ac0;
  longlong local_ab8;
  longlong lStack_ab0;
  longlong local_aa8;
  longlong lStack_aa0;
  longlong local_a98;
  longlong lStack_a90;
  longlong local_a88;
  longlong lStack_a80;
  longlong local_a78;
  longlong lStack_a70;
  longlong local_a68;
  longlong lStack_a60;
  longlong local_a58;
  longlong lStack_a50;
  longlong local_a48;
  longlong lStack_a40;
  longlong local_a38;
  longlong lStack_a30;
  longlong local_a28;
  longlong lStack_a20;
  longlong local_a18;
  longlong lStack_a10;
  longlong local_a08;
  longlong lStack_a00;
  longlong local_9f8;
  longlong lStack_9f0;
  longlong local_9e8;
  longlong lStack_9e0;
  longlong local_9d8;
  longlong lStack_9d0;
  longlong local_9c8;
  longlong lStack_9c0;
  longlong local_9b8;
  longlong lStack_9b0;
  longlong local_9a8;
  longlong lStack_9a0;
  longlong local_998;
  longlong lStack_990;
  longlong local_988;
  longlong lStack_980;
  longlong local_978;
  longlong lStack_970;
  longlong local_968;
  longlong lStack_960;
  longlong local_958;
  longlong lStack_950;
  longlong local_948;
  longlong lStack_940;
  longlong local_938;
  longlong lStack_930;
  longlong local_928;
  longlong lStack_920;
  longlong local_918;
  longlong lStack_910;
  longlong local_908;
  longlong lStack_900;
  longlong local_8f8;
  longlong lStack_8f0;
  longlong local_8e8;
  longlong lStack_8e0;
  longlong local_8d8;
  longlong lStack_8d0;
  longlong local_8c8;
  longlong lStack_8c0;
  longlong local_8b8;
  longlong lStack_8b0;
  longlong local_8a8;
  longlong lStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  int local_86c;
  longlong local_868;
  longlong lStack_860;
  int32_t *local_850;
  uint local_848;
  uint local_844;
  int local_83c;
  int local_838;
  uint local_834;
  long local_828;
  int local_81c;
  int local_818;
  int local_814;
  int local_810;
  int local_80c;
  int local_808;
  int local_804;
  int local_800;
  int local_7fc;
  int local_7f8;
  int local_7f4;
  int local_7f0;
  int local_7ec;
  int local_7e8;
  int local_7e4;
  int local_7e0;
  int local_7dc;
  int local_7d8;
  int local_7d4;
  int local_7d0;
  int local_7cc;
  int32_t local_7c8;
  int32_t local_7c4;
  int32_t local_7c0;
  int32_t local_7bc;
  int32_t local_7b8;
  int32_t local_7b4;
  int32_t local_7b0;
  int32_t local_7ac;
  int32_t local_7a8;
  int32_t local_7a4;
  int32_t local_7a0;
  int32_t local_79c;
  int32_t local_798;
  int32_t local_794;
  int32_t local_790;
  int32_t local_78c;
  int32_t local_788;
  int32_t local_784;
  int32_t local_780;
  int32_t local_77c;
  int32_t local_778;
  int32_t local_774;
  int32_t local_770;
  int32_t local_76c;
  int32_t local_768;
  int32_t local_764;
  int32_t local_760;
  int32_t local_75c;
  int32_t local_758;
  int32_t local_754;
  int32_t local_750;
  int32_t local_74c;
  int32_t local_748;
  int local_744;
  int local_740;
  int local_73c;
  longlong local_738;
  longlong lStack_730;
  int local_728;
  int local_724;
  int local_720;
  int local_71c;
  undefined8 local_718;
  undefined8 uStack_710;
  int local_708;
  int local_704;
  int local_700;
  int local_6fc;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  int local_6e8;
  int local_6e4;
  int local_6e0;
  int local_6dc;
  longlong local_6d8;
  longlong lStack_6d0;
  int32_t local_6c8;
  int32_t local_6c4;
  int32_t local_6c0;
  int32_t local_6bc;
  longlong local_6b8;
  longlong lStack_6b0;
  int32_t local_6a8;
  int32_t local_6a4;
  int32_t local_6a0;
  int32_t local_69c;
  longlong local_698;
  longlong lStack_690;
  int32_t local_688;
  int32_t local_684;
  int32_t local_680;
  int32_t local_67c;
  longlong local_678;
  longlong lStack_670;
  int32_t local_668;
  int32_t local_664;
  int32_t local_660;
  int32_t local_65c;
  longlong local_658;
  longlong lStack_650;
  int32_t local_648;
  int32_t local_644;
  int32_t local_640;
  int32_t local_63c;
  longlong local_638;
  longlong lStack_630;
  int32_t local_628;
  int32_t local_624;
  int32_t local_620;
  int32_t local_61c;
  longlong local_618;
  longlong lStack_610;
  int32_t local_608;
  int32_t local_604;
  int32_t local_600;
  int32_t local_5fc;
  longlong local_5f8;
  longlong lStack_5f0;
  int32_t local_5e8;
  int32_t local_5e4;
  int32_t local_5e0;
  int32_t local_5dc;
  longlong local_5d8;
  longlong lStack_5d0;
  int32_t local_5c8;
  int32_t local_5c4;
  int32_t local_5c0;
  int32_t local_5bc;
  longlong local_5b8;
  longlong lStack_5b0;
  int32_t local_5a8;
  int32_t local_5a4;
  int32_t local_5a0;
  int32_t local_59c;
  longlong local_598;
  longlong lStack_590;
  int32_t local_588;
  int32_t local_584;
  int32_t local_580;
  int32_t local_57c;
  longlong local_578;
  longlong lStack_570;
  int32_t local_568;
  int32_t local_564;
  int32_t local_560;
  int32_t local_55c;
  longlong local_558;
  longlong lStack_550;
  int32_t local_548;
  int32_t local_544;
  int32_t local_540;
  int32_t local_53c;
  longlong local_538;
  longlong lStack_530;
  int32_t local_528;
  int32_t local_524;
  int32_t local_520;
  int32_t local_51c;
  longlong local_518;
  longlong lStack_510;
  int32_t local_508;
  int32_t local_504;
  int32_t local_500;
  int32_t local_4fc;
  longlong local_4f8;
  longlong lStack_4f0;
  int32_t local_4e8;
  int32_t local_4e4;
  int32_t local_4e0;
  int32_t local_4dc;
  longlong local_4d8;
  longlong lStack_4d0;
  int32_t local_4c8;
  int32_t local_4c4;
  int32_t local_4c0;
  int32_t local_4bc;
  longlong local_4b8;
  longlong lStack_4b0;
  int32_t local_4a8;
  int32_t local_4a4;
  int32_t local_4a0;
  int32_t local_49c;
  longlong local_498;
  longlong lStack_490;
  int32_t local_488;
  int32_t local_484;
  int32_t local_480;
  int32_t local_47c;
  longlong local_478;
  longlong lStack_470;
  int32_t local_468;
  int32_t local_464;
  int32_t local_460;
  int32_t local_45c;
  longlong local_458;
  longlong lStack_450;
  int32_t local_448;
  int32_t local_444;
  int32_t local_440;
  int32_t local_43c;
  longlong local_438;
  longlong lStack_430;
  int32_t local_428;
  int32_t local_424;
  int32_t local_420;
  int32_t local_41c;
  longlong local_418;
  longlong lStack_410;
  int32_t local_408;
  int32_t local_404;
  int32_t local_400;
  int32_t local_3fc;
  longlong local_3f8;
  longlong lStack_3f0;
  int32_t local_3e8;
  int32_t local_3e4;
  int32_t local_3e0;
  int32_t local_3dc;
  longlong local_3d8;
  longlong lStack_3d0;
  int32_t local_3c8;
  int32_t local_3c4;
  int32_t local_3c0;
  int32_t local_3bc;
  longlong local_3b8;
  longlong lStack_3b0;
  int32_t local_3a8;
  int32_t local_3a4;
  int32_t local_3a0;
  int32_t local_39c;
  longlong local_398;
  longlong lStack_390;
  int32_t local_388;
  int32_t local_384;
  int32_t local_380;
  int32_t local_37c;
  longlong local_378;
  longlong lStack_370;
  int32_t local_368;
  int32_t local_364;
  int32_t local_360;
  int32_t local_35c;
  longlong local_358;
  longlong lStack_350;
  int32_t local_348;
  int32_t local_344;
  int32_t local_340;
  int32_t local_33c;
  longlong local_338;
  longlong lStack_330;
  int32_t local_328;
  int32_t local_324;
  int32_t local_320;
  int32_t local_31c;
  longlong local_318;
  longlong lStack_310;
  int32_t local_308;
  int32_t local_304;
  int32_t local_300;
  int32_t local_2fc;
  longlong local_2f8;
  longlong lStack_2f0;
  int32_t local_2e8;
  int32_t local_2e4;
  int32_t local_2e0;
  int32_t local_2dc;
  longlong local_2d8;
  longlong lStack_2d0;
  int32_t local_2c8;
  int32_t local_2c4;
  int32_t local_2c0;
  int32_t local_2bc;
  longlong local_2b8;
  longlong lStack_2b0;
  int local_2a8;
  int local_2a4;
  int local_2a0;
  int local_29c;
  longlong local_298;
  longlong lStack_290;
  int local_288;
  int local_284;
  int local_280;
  int local_27c;
  longlong local_278;
  longlong lStack_270;
  int local_268;
  int local_264;
  int local_260;
  int local_25c;
  longlong local_258;
  longlong lStack_250;
  int local_248;
  int local_244;
  int local_240;
  int local_23c;
  longlong local_238;
  longlong lStack_230;
  int local_228;
  int local_224;
  int local_220;
  int local_21c;
  longlong local_218;
  longlong lStack_210;
  int local_208;
  int local_204;
  int local_200;
  int local_1fc;
  longlong local_1f8;
  longlong lStack_1f0;
  int local_1e8;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  longlong local_1d8;
  longlong lStack_1d0;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  longlong local_1b8;
  longlong lStack_1b0;
  int local_1a8;
  int local_1a4;
  int local_1a0;
  int local_19c;
  longlong local_198;
  longlong lStack_190;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  longlong local_178;
  longlong lStack_170;
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  longlong local_158;
  longlong lStack_150;
  int local_148;
  int local_144;
  int local_140;
  int local_13c;
  longlong local_138;
  longlong lStack_130;
  int local_128;
  int local_124;
  int local_120;
  int local_11c;
  longlong local_118;
  longlong lStack_110;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  longlong local_f8;
  longlong lStack_f0;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  longlong local_d8;
  longlong lStack_d0;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  longlong local_b8;
  longlong lStack_b0;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  longlong local_98;
  longlong lStack_90;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  longlong local_78;
  longlong lStack_70;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  longlong local_58;
  longlong lStack_50;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  longlong local_38;
  longlong lStack_30;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  
  local_83c = in_R8D;
  local_838 = in_ECX;
  local_834 = in_EDX;
  local_828 = in_RDI;
  local_850 = cospi_arr(in_EDX);
  local_73c = 1 << ((char)local_834 - 1U & 0x1f);
  local_868 = CONCAT44(local_73c,local_73c);
  lStack_860 = CONCAT44(local_73c,local_73c);
  iVar1 = 8;
  if (local_838 != 0) {
    iVar1 = 6;
  }
  if (local_83c + iVar1 < 0x10) {
    local_103c = 0x10;
  }
  else {
    local_103c = 8;
    if (local_838 != 0) {
      local_103c = 6;
    }
    local_103c = local_83c + local_103c;
  }
  local_86c = local_103c;
  iVar1 = local_86c;
  local_86c._0_1_ = (char)local_103c;
  local_740 = -(1 << ((char)local_86c - 1U & 0x1f));
  local_888 = CONCAT44(local_740,local_740);
  uStack_880 = CONCAT44(local_740,local_740);
  local_744 = (1 << ((char)local_86c - 1U & 0x1f)) + -1;
  local_898 = CONCAT44(local_744,local_744);
  uStack_890 = CONCAT44(local_744,local_744);
  local_748 = local_850[1];
  local_8a8 = CONCAT44(local_748,local_748);
  lStack_8a0 = CONCAT44(local_748,local_748);
  local_74c = local_850[2];
  local_8b8 = CONCAT44(local_74c,local_74c);
  lStack_8b0 = CONCAT44(local_74c,local_74c);
  local_750 = local_850[3];
  local_8c8 = CONCAT44(local_750,local_750);
  lStack_8c0 = CONCAT44(local_750,local_750);
  local_754 = local_850[4];
  local_8d8 = CONCAT44(local_754,local_754);
  lStack_8d0 = CONCAT44(local_754,local_754);
  local_758 = local_850[5];
  local_8e8 = CONCAT44(local_758,local_758);
  lStack_8e0 = CONCAT44(local_758,local_758);
  local_75c = local_850[6];
  local_8f8 = CONCAT44(local_75c,local_75c);
  lStack_8f0 = CONCAT44(local_75c,local_75c);
  local_760 = local_850[7];
  local_908 = CONCAT44(local_760,local_760);
  lStack_900 = CONCAT44(local_760,local_760);
  local_764 = local_850[8];
  local_918 = CONCAT44(local_764,local_764);
  lStack_910 = CONCAT44(local_764,local_764);
  local_768 = local_850[9];
  local_928 = CONCAT44(local_768,local_768);
  lStack_920 = CONCAT44(local_768,local_768);
  local_76c = local_850[10];
  local_938 = CONCAT44(local_76c,local_76c);
  lStack_930 = CONCAT44(local_76c,local_76c);
  local_770 = local_850[0xb];
  local_948 = CONCAT44(local_770,local_770);
  lStack_940 = CONCAT44(local_770,local_770);
  local_774 = local_850[0xc];
  local_958 = CONCAT44(local_774,local_774);
  lStack_950 = CONCAT44(local_774,local_774);
  local_778 = local_850[0xd];
  local_968 = CONCAT44(local_778,local_778);
  lStack_960 = CONCAT44(local_778,local_778);
  local_77c = local_850[0xe];
  local_978 = CONCAT44(local_77c,local_77c);
  lStack_970 = CONCAT44(local_77c,local_77c);
  local_780 = local_850[0xf];
  local_988 = CONCAT44(local_780,local_780);
  lStack_980 = CONCAT44(local_780,local_780);
  local_784 = local_850[0x10];
  local_998 = CONCAT44(local_784,local_784);
  lStack_990 = CONCAT44(local_784,local_784);
  local_788 = local_850[0x14];
  local_9a8 = CONCAT44(local_788,local_788);
  lStack_9a0 = CONCAT44(local_788,local_788);
  local_78c = local_850[0x18];
  local_9b8 = CONCAT44(local_78c,local_78c);
  lStack_9b0 = CONCAT44(local_78c,local_78c);
  local_790 = local_850[0x1c];
  local_9c8 = CONCAT44(local_790,local_790);
  lStack_9c0 = CONCAT44(local_790,local_790);
  local_794 = local_850[0x20];
  local_9d8 = CONCAT44(local_794,local_794);
  lStack_9d0 = CONCAT44(local_794,local_794);
  local_798 = local_850[0x24];
  local_9e8 = CONCAT44(local_798,local_798);
  lStack_9e0 = CONCAT44(local_798,local_798);
  local_79c = local_850[0x28];
  local_9f8 = CONCAT44(local_79c,local_79c);
  lStack_9f0 = CONCAT44(local_79c,local_79c);
  local_7a0 = local_850[0x2c];
  local_a08 = CONCAT44(local_7a0,local_7a0);
  lStack_a00 = CONCAT44(local_7a0,local_7a0);
  local_7a4 = local_850[0x30];
  local_a18 = CONCAT44(local_7a4,local_7a4);
  lStack_a10 = CONCAT44(local_7a4,local_7a4);
  local_7a8 = local_850[0x33];
  local_a28 = CONCAT44(local_7a8,local_7a8);
  lStack_a20 = CONCAT44(local_7a8,local_7a8);
  local_7ac = local_850[0x34];
  local_a38 = CONCAT44(local_7ac,local_7ac);
  lStack_a30 = CONCAT44(local_7ac,local_7ac);
  local_7b0 = local_850[0x36];
  local_a48 = CONCAT44(local_7b0,local_7b0);
  lStack_a40 = CONCAT44(local_7b0,local_7b0);
  local_7b4 = local_850[0x37];
  local_a58 = CONCAT44(local_7b4,local_7b4);
  lStack_a50 = CONCAT44(local_7b4,local_7b4);
  local_7b8 = local_850[0x38];
  local_a68 = CONCAT44(local_7b8,local_7b8);
  lStack_a60 = CONCAT44(local_7b8,local_7b8);
  local_7bc = local_850[0x3b];
  local_a78 = CONCAT44(local_7bc,local_7bc);
  lStack_a70 = CONCAT44(local_7bc,local_7bc);
  local_7c0 = local_850[0x3c];
  local_a88 = CONCAT44(local_7c0,local_7c0);
  lStack_a80 = CONCAT44(local_7c0,local_7c0);
  local_7c4 = local_850[0x3e];
  local_a98 = CONCAT44(local_7c4,local_7c4);
  lStack_a90 = CONCAT44(local_7c4,local_7c4);
  local_7c8 = local_850[0x3f];
  local_aa8 = CONCAT44(local_7c8,local_7c8);
  lStack_aa0 = CONCAT44(local_7c8,local_7c8);
  local_7cc = -local_850[4];
  local_ab8 = CONCAT44(local_7cc,local_7cc);
  lStack_ab0 = CONCAT44(local_7cc,local_7cc);
  local_7d0 = -local_850[8];
  local_ac8 = CONCAT44(local_7d0,local_7d0);
  lStack_ac0 = CONCAT44(local_7d0,local_7d0);
  local_7d4 = -local_850[0xc];
  local_ad8 = CONCAT44(local_7d4,local_7d4);
  lStack_ad0 = CONCAT44(local_7d4,local_7d4);
  local_7d8 = -local_850[0x10];
  local_ae8 = CONCAT44(local_7d8,local_7d8);
  lStack_ae0 = CONCAT44(local_7d8,local_7d8);
  local_7dc = -local_850[0x14];
  local_af8 = CONCAT44(local_7dc,local_7dc);
  lStack_af0 = CONCAT44(local_7dc,local_7dc);
  local_7e0 = -local_850[0x18];
  local_b08 = CONCAT44(local_7e0,local_7e0);
  lStack_b00 = CONCAT44(local_7e0,local_7e0);
  local_7e4 = -local_850[0x1c];
  local_b18 = CONCAT44(local_7e4,local_7e4);
  lStack_b10 = CONCAT44(local_7e4,local_7e4);
  local_7e8 = -local_850[0x20];
  local_b28 = CONCAT44(local_7e8,local_7e8);
  lStack_b20 = CONCAT44(local_7e8,local_7e8);
  local_7ec = -local_850[0x24];
  local_b38 = CONCAT44(local_7ec,local_7ec);
  lStack_b30 = CONCAT44(local_7ec,local_7ec);
  local_7f0 = -local_850[0x28];
  local_b48 = CONCAT44(local_7f0,local_7f0);
  lStack_b40 = CONCAT44(local_7f0,local_7f0);
  local_7f4 = -local_850[0x2c];
  local_b58 = CONCAT44(local_7f4,local_7f4);
  lStack_b50 = CONCAT44(local_7f4,local_7f4);
  local_7f8 = -local_850[0x30];
  local_b68 = CONCAT44(local_7f8,local_7f8);
  lStack_b60 = CONCAT44(local_7f8,local_7f8);
  local_7fc = -local_850[0x31];
  local_b78 = CONCAT44(local_7fc,local_7fc);
  lStack_b70 = CONCAT44(local_7fc,local_7fc);
  local_800 = -local_850[0x32];
  local_b88 = CONCAT44(local_800,local_800);
  lStack_b80 = CONCAT44(local_800,local_800);
  local_804 = -local_850[0x34];
  local_b98 = CONCAT44(local_804,local_804);
  lStack_b90 = CONCAT44(local_804,local_804);
  local_808 = -local_850[0x35];
  local_ba8 = CONCAT44(local_808,local_808);
  lStack_ba0 = CONCAT44(local_808,local_808);
  local_80c = -local_850[0x38];
  local_bb8 = CONCAT44(local_80c,local_80c);
  lStack_bb0 = CONCAT44(local_80c,local_80c);
  local_810 = -local_850[0x39];
  local_bc8 = CONCAT44(local_810,local_810);
  lStack_bc0 = CONCAT44(local_810,local_810);
  local_814 = -local_850[0x3a];
  local_bd8 = CONCAT44(local_814,local_814);
  lStack_bd0 = CONCAT44(local_814,local_814);
  local_818 = -local_850[0x3c];
  local_be8 = CONCAT44(local_818,local_818);
  lStack_be0 = CONCAT44(local_818,local_818);
  local_81c = -local_850[0x3d];
  local_bf8 = CONCAT44(local_81c,local_81c);
  lStack_bf0 = CONCAT44(local_81c,local_81c);
  local_df8 = *(longlong *)(local_828 + 0x10);
  lStack_df0 = *(longlong *)(local_828 + 0x18);
  local_db8 = *(longlong *)(local_828 + 0x90);
  lStack_db0 = *(longlong *)(local_828 + 0x98);
  local_d78 = *(longlong *)(local_828 + 0x50);
  lStack_d70 = *(longlong *)(local_828 + 0x58);
  local_d38 = *(longlong *)(local_828 + 0xd0);
  lStack_d30 = *(longlong *)(local_828 + 0xd8);
  local_cf8 = *(longlong *)(local_828 + 0x30);
  lStack_cf0 = *(longlong *)(local_828 + 0x38);
  local_cb8 = *(longlong *)(local_828 + 0xb0);
  lStack_cb0 = *(longlong *)(local_828 + 0xb8);
  local_c78 = *(longlong *)(local_828 + 0x70);
  lStack_c70 = *(longlong *)(local_828 + 0x78);
  local_c38 = *(longlong *)(local_828 + 0xf0);
  lStack_c30 = *(longlong *)(local_828 + 0xf8);
  local_ef8 = *(longlong *)(local_828 + 0x20);
  lStack_ef0 = *(longlong *)(local_828 + 0x28);
  local_eb8 = *(longlong *)(local_828 + 0xa0);
  lStack_eb0 = *(longlong *)(local_828 + 0xa8);
  local_e78 = *(longlong *)(local_828 + 0x60);
  lStack_e70 = *(longlong *)(local_828 + 0x68);
  local_e38 = *(longlong *)(local_828 + 0xe0);
  lStack_e30 = *(longlong *)(local_828 + 0xe8);
  local_fb8 = *(longlong *)(local_828 + 0x80);
  local_f78 = *(longlong *)(local_828 + 0x40);
  lStack_f70 = *(longlong *)(local_828 + 0x48);
  local_f38 = *(longlong *)(local_828 + 0xc0);
  lStack_f30 = *(longlong *)(local_828 + 200);
  local_86c = iVar1;
  local_738 = local_868;
  lStack_730 = lStack_860;
  local_728 = local_73c;
  local_724 = local_73c;
  local_720 = local_73c;
  local_71c = local_73c;
  local_718 = local_888;
  uStack_710 = uStack_880;
  local_708 = local_740;
  local_704 = local_740;
  local_700 = local_740;
  local_6fc = local_740;
  local_6f8 = local_898;
  uStack_6f0 = uStack_890;
  local_6e8 = local_744;
  local_6e4 = local_744;
  local_6e0 = local_744;
  local_6dc = local_744;
  local_6d8 = local_8a8;
  lStack_6d0 = lStack_8a0;
  local_6c8 = local_748;
  local_6c4 = local_748;
  local_6c0 = local_748;
  local_6bc = local_748;
  local_6b8 = local_8b8;
  lStack_6b0 = lStack_8b0;
  local_6a8 = local_74c;
  local_6a4 = local_74c;
  local_6a0 = local_74c;
  local_69c = local_74c;
  local_698 = local_8c8;
  lStack_690 = lStack_8c0;
  local_688 = local_750;
  local_684 = local_750;
  local_680 = local_750;
  local_67c = local_750;
  local_678 = local_8d8;
  lStack_670 = lStack_8d0;
  local_668 = local_754;
  local_664 = local_754;
  local_660 = local_754;
  local_65c = local_754;
  local_658 = local_8e8;
  lStack_650 = lStack_8e0;
  local_648 = local_758;
  local_644 = local_758;
  local_640 = local_758;
  local_63c = local_758;
  local_638 = local_8f8;
  lStack_630 = lStack_8f0;
  local_628 = local_75c;
  local_624 = local_75c;
  local_620 = local_75c;
  local_61c = local_75c;
  local_618 = local_908;
  lStack_610 = lStack_900;
  local_608 = local_760;
  local_604 = local_760;
  local_600 = local_760;
  local_5fc = local_760;
  local_5f8 = local_918;
  lStack_5f0 = lStack_910;
  local_5e8 = local_764;
  local_5e4 = local_764;
  local_5e0 = local_764;
  local_5dc = local_764;
  local_5d8 = local_928;
  lStack_5d0 = lStack_920;
  local_5c8 = local_768;
  local_5c4 = local_768;
  local_5c0 = local_768;
  local_5bc = local_768;
  local_5b8 = local_938;
  lStack_5b0 = lStack_930;
  local_5a8 = local_76c;
  local_5a4 = local_76c;
  local_5a0 = local_76c;
  local_59c = local_76c;
  local_598 = local_948;
  lStack_590 = lStack_940;
  local_588 = local_770;
  local_584 = local_770;
  local_580 = local_770;
  local_57c = local_770;
  local_578 = local_958;
  lStack_570 = lStack_950;
  local_568 = local_774;
  local_564 = local_774;
  local_560 = local_774;
  local_55c = local_774;
  local_558 = local_968;
  lStack_550 = lStack_960;
  local_548 = local_778;
  local_544 = local_778;
  local_540 = local_778;
  local_53c = local_778;
  local_538 = local_978;
  lStack_530 = lStack_970;
  local_528 = local_77c;
  local_524 = local_77c;
  local_520 = local_77c;
  local_51c = local_77c;
  local_518 = local_988;
  lStack_510 = lStack_980;
  local_508 = local_780;
  local_504 = local_780;
  local_500 = local_780;
  local_4fc = local_780;
  local_4f8 = local_998;
  lStack_4f0 = lStack_990;
  local_4e8 = local_784;
  local_4e4 = local_784;
  local_4e0 = local_784;
  local_4dc = local_784;
  local_4d8 = local_9a8;
  lStack_4d0 = lStack_9a0;
  local_4c8 = local_788;
  local_4c4 = local_788;
  local_4c0 = local_788;
  local_4bc = local_788;
  local_4b8 = local_9b8;
  lStack_4b0 = lStack_9b0;
  local_4a8 = local_78c;
  local_4a4 = local_78c;
  local_4a0 = local_78c;
  local_49c = local_78c;
  local_498 = local_9c8;
  lStack_490 = lStack_9c0;
  local_488 = local_790;
  local_484 = local_790;
  local_480 = local_790;
  local_47c = local_790;
  local_478 = local_9d8;
  lStack_470 = lStack_9d0;
  local_468 = local_794;
  local_464 = local_794;
  local_460 = local_794;
  local_45c = local_794;
  local_458 = local_9e8;
  lStack_450 = lStack_9e0;
  local_448 = local_798;
  local_444 = local_798;
  local_440 = local_798;
  local_43c = local_798;
  local_438 = local_9f8;
  lStack_430 = lStack_9f0;
  local_428 = local_79c;
  local_424 = local_79c;
  local_420 = local_79c;
  local_41c = local_79c;
  local_418 = local_a08;
  lStack_410 = lStack_a00;
  local_408 = local_7a0;
  local_404 = local_7a0;
  local_400 = local_7a0;
  local_3fc = local_7a0;
  local_3f8 = local_a18;
  lStack_3f0 = lStack_a10;
  local_3e8 = local_7a4;
  local_3e4 = local_7a4;
  local_3e0 = local_7a4;
  local_3dc = local_7a4;
  local_3d8 = local_a28;
  lStack_3d0 = lStack_a20;
  local_3c8 = local_7a8;
  local_3c4 = local_7a8;
  local_3c0 = local_7a8;
  local_3bc = local_7a8;
  local_3b8 = local_a38;
  lStack_3b0 = lStack_a30;
  local_3a8 = local_7ac;
  local_3a4 = local_7ac;
  local_3a0 = local_7ac;
  local_39c = local_7ac;
  local_398 = local_a48;
  lStack_390 = lStack_a40;
  local_388 = local_7b0;
  local_384 = local_7b0;
  local_380 = local_7b0;
  local_37c = local_7b0;
  local_378 = local_a58;
  lStack_370 = lStack_a50;
  local_368 = local_7b4;
  local_364 = local_7b4;
  local_360 = local_7b4;
  local_35c = local_7b4;
  local_358 = local_a68;
  lStack_350 = lStack_a60;
  local_348 = local_7b8;
  local_344 = local_7b8;
  local_340 = local_7b8;
  local_33c = local_7b8;
  local_338 = local_a78;
  lStack_330 = lStack_a70;
  local_328 = local_7bc;
  local_324 = local_7bc;
  local_320 = local_7bc;
  local_31c = local_7bc;
  local_318 = local_a88;
  lStack_310 = lStack_a80;
  local_308 = local_7c0;
  local_304 = local_7c0;
  local_300 = local_7c0;
  local_2fc = local_7c0;
  local_2f8 = local_a98;
  lStack_2f0 = lStack_a90;
  local_2e8 = local_7c4;
  local_2e4 = local_7c4;
  local_2e0 = local_7c4;
  local_2dc = local_7c4;
  local_2d8 = local_aa8;
  lStack_2d0 = lStack_aa0;
  local_2c8 = local_7c8;
  local_2c4 = local_7c8;
  local_2c0 = local_7c8;
  local_2bc = local_7c8;
  local_2b8 = local_ab8;
  lStack_2b0 = lStack_ab0;
  local_2a8 = local_7cc;
  local_2a4 = local_7cc;
  local_2a0 = local_7cc;
  local_29c = local_7cc;
  local_298 = local_ac8;
  lStack_290 = lStack_ac0;
  local_288 = local_7d0;
  local_284 = local_7d0;
  local_280 = local_7d0;
  local_27c = local_7d0;
  local_278 = local_ad8;
  lStack_270 = lStack_ad0;
  local_268 = local_7d4;
  local_264 = local_7d4;
  local_260 = local_7d4;
  local_25c = local_7d4;
  local_258 = local_ae8;
  lStack_250 = lStack_ae0;
  local_248 = local_7d8;
  local_244 = local_7d8;
  local_240 = local_7d8;
  local_23c = local_7d8;
  local_238 = local_af8;
  lStack_230 = lStack_af0;
  local_228 = local_7dc;
  local_224 = local_7dc;
  local_220 = local_7dc;
  local_21c = local_7dc;
  local_218 = local_b08;
  lStack_210 = lStack_b00;
  local_208 = local_7e0;
  local_204 = local_7e0;
  local_200 = local_7e0;
  local_1fc = local_7e0;
  local_1f8 = local_b18;
  lStack_1f0 = lStack_b10;
  local_1e8 = local_7e4;
  local_1e4 = local_7e4;
  local_1e0 = local_7e4;
  local_1dc = local_7e4;
  local_1d8 = local_b28;
  lStack_1d0 = lStack_b20;
  local_1c8 = local_7e8;
  local_1c4 = local_7e8;
  local_1c0 = local_7e8;
  local_1bc = local_7e8;
  local_1b8 = local_b38;
  lStack_1b0 = lStack_b30;
  local_1a8 = local_7ec;
  local_1a4 = local_7ec;
  local_1a0 = local_7ec;
  local_19c = local_7ec;
  local_198 = local_b48;
  lStack_190 = lStack_b40;
  local_188 = local_7f0;
  local_184 = local_7f0;
  local_180 = local_7f0;
  local_17c = local_7f0;
  local_178 = local_b58;
  lStack_170 = lStack_b50;
  local_168 = local_7f4;
  local_164 = local_7f4;
  local_160 = local_7f4;
  local_15c = local_7f4;
  local_158 = local_b68;
  lStack_150 = lStack_b60;
  local_148 = local_7f8;
  local_144 = local_7f8;
  local_140 = local_7f8;
  local_13c = local_7f8;
  local_138 = local_b78;
  lStack_130 = lStack_b70;
  local_128 = local_7fc;
  local_124 = local_7fc;
  local_120 = local_7fc;
  local_11c = local_7fc;
  local_118 = local_b88;
  lStack_110 = lStack_b80;
  local_108 = local_800;
  local_104 = local_800;
  local_100 = local_800;
  local_fc = local_800;
  local_f8 = local_b98;
  lStack_f0 = lStack_b90;
  local_e8 = local_804;
  local_e4 = local_804;
  local_e0 = local_804;
  local_dc = local_804;
  local_d8 = local_ba8;
  lStack_d0 = lStack_ba0;
  local_c8 = local_808;
  local_c4 = local_808;
  local_c0 = local_808;
  local_bc = local_808;
  local_b8 = local_bb8;
  lStack_b0 = lStack_bb0;
  local_a8 = local_80c;
  local_a4 = local_80c;
  local_a0 = local_80c;
  local_9c = local_80c;
  local_98 = local_bc8;
  lStack_90 = lStack_bc0;
  local_88 = local_810;
  local_84 = local_810;
  local_80 = local_810;
  local_7c = local_810;
  local_78 = local_bd8;
  lStack_70 = lStack_bd0;
  local_68 = local_814;
  local_64 = local_814;
  local_60 = local_814;
  local_5c = local_814;
  local_58 = local_be8;
  lStack_50 = lStack_be0;
  local_48 = local_818;
  local_44 = local_818;
  local_40 = local_818;
  local_3c = local_818;
  local_38 = local_bf8;
  lStack_30 = lStack_bf0;
  local_20 = local_81c;
  local_1c = local_81c;
  local_18 = local_81c;
  local_14 = local_81c;
  half_btf_0_sse4_1((__m128i *)&local_8a8,(__m128i *)&local_df8,(__m128i *)&local_868,local_834);
  local_c08 = extraout_XMM0_Qa;
  lStack_c00 = extraout_XMM0_Qb;
  half_btf_0_sse4_1((__m128i *)&local_aa8,(__m128i *)&local_df8,(__m128i *)&local_868,local_834);
  local_df8 = extraout_XMM0_Qa_00;
  lStack_df0 = extraout_XMM0_Qb_00;
  half_btf_0_sse4_1((__m128i *)&local_b78,(__m128i *)&local_c38,(__m128i *)&local_868,local_834);
  local_dc8 = extraout_XMM0_Qa_01;
  lStack_dc0 = extraout_XMM0_Qb_01;
  half_btf_0_sse4_1((__m128i *)&local_988,(__m128i *)&local_c38,(__m128i *)&local_868,local_834);
  local_c38 = extraout_XMM0_Qa_02;
  lStack_c30 = extraout_XMM0_Qb_02;
  half_btf_0_sse4_1((__m128i *)&local_928,(__m128i *)&local_db8,(__m128i *)&local_868,local_834);
  local_c48 = extraout_XMM0_Qa_03;
  lStack_c40 = extraout_XMM0_Qb_03;
  half_btf_0_sse4_1((__m128i *)&local_a58,(__m128i *)&local_db8,(__m128i *)&local_868,local_834);
  local_db8 = extraout_XMM0_Qa_04;
  lStack_db0 = extraout_XMM0_Qb_04;
  half_btf_0_sse4_1((__m128i *)&local_bc8,(__m128i *)&local_c78,(__m128i *)&local_868,local_834);
  local_d88 = extraout_XMM0_Qa_05;
  lStack_d80 = extraout_XMM0_Qb_05;
  half_btf_0_sse4_1((__m128i *)&local_908,(__m128i *)&local_c78,(__m128i *)&local_868,local_834);
  local_c78 = extraout_XMM0_Qa_06;
  lStack_c70 = extraout_XMM0_Qb_06;
  half_btf_0_sse4_1((__m128i *)&local_8e8,(__m128i *)&local_d78,(__m128i *)&local_868,local_834);
  local_c88 = extraout_XMM0_Qa_07;
  lStack_c80 = extraout_XMM0_Qb_07;
  half_btf_0_sse4_1((__m128i *)&local_a78,(__m128i *)&local_d78,(__m128i *)&local_868,local_834);
  local_d78 = extraout_XMM0_Qa_08;
  lStack_d70 = extraout_XMM0_Qb_08;
  half_btf_0_sse4_1((__m128i *)&local_ba8,(__m128i *)&local_cb8,(__m128i *)&local_868,local_834);
  local_d48 = extraout_XMM0_Qa_09;
  lStack_d40 = extraout_XMM0_Qb_09;
  half_btf_0_sse4_1((__m128i *)&local_948,(__m128i *)&local_cb8,(__m128i *)&local_868,local_834);
  local_cb8 = extraout_XMM0_Qa_10;
  lStack_cb0 = extraout_XMM0_Qb_10;
  half_btf_0_sse4_1((__m128i *)&local_bf8,(__m128i *)&local_cf8,(__m128i *)&local_868,local_834);
  local_d08 = extraout_XMM0_Qa_11;
  lStack_d00 = extraout_XMM0_Qb_11;
  half_btf_0_sse4_1((__m128i *)&local_8c8,(__m128i *)&local_cf8,(__m128i *)&local_868,local_834);
  local_cf8 = extraout_XMM0_Qa_12;
  lStack_cf0 = extraout_XMM0_Qb_12;
  half_btf_0_sse4_1((__m128i *)&local_968,(__m128i *)&local_d38,(__m128i *)&local_868,local_834);
  local_cc8 = extraout_XMM0_Qa_13;
  lStack_cc0 = extraout_XMM0_Qb_13;
  half_btf_0_sse4_1((__m128i *)&local_a28,(__m128i *)&local_d38,(__m128i *)&local_868,local_834);
  local_d38 = extraout_XMM0_Qa_14;
  lStack_d30 = extraout_XMM0_Qb_14;
  half_btf_0_sse4_1((__m128i *)&local_8b8,(__m128i *)&local_ef8,(__m128i *)&local_868,local_834);
  local_e08 = extraout_XMM0_Qa_15;
  lStack_e00 = extraout_XMM0_Qb_15;
  half_btf_0_sse4_1((__m128i *)&local_a98,(__m128i *)&local_ef8,(__m128i *)&local_868,local_834);
  local_ef8 = extraout_XMM0_Qa_16;
  lStack_ef0 = extraout_XMM0_Qb_16;
  half_btf_0_sse4_1((__m128i *)&local_b88,(__m128i *)&local_e38,(__m128i *)&local_868,local_834);
  local_ec8 = extraout_XMM0_Qa_17;
  lStack_ec0 = extraout_XMM0_Qb_17;
  half_btf_0_sse4_1((__m128i *)&local_978,(__m128i *)&local_e38,(__m128i *)&local_868,local_834);
  local_e38 = extraout_XMM0_Qa_18;
  lStack_e30 = extraout_XMM0_Qb_18;
  half_btf_0_sse4_1((__m128i *)&local_938,(__m128i *)&local_eb8,(__m128i *)&local_868,local_834);
  local_e48 = extraout_XMM0_Qa_19;
  lStack_e40 = extraout_XMM0_Qb_19;
  half_btf_0_sse4_1((__m128i *)&local_a48,(__m128i *)&local_eb8,(__m128i *)&local_868,local_834);
  local_eb8 = extraout_XMM0_Qa_20;
  lStack_eb0 = extraout_XMM0_Qb_20;
  half_btf_0_sse4_1((__m128i *)&local_bd8,(__m128i *)&local_e78,(__m128i *)&local_868,local_834);
  local_e88 = extraout_XMM0_Qa_21;
  lStack_e80 = extraout_XMM0_Qb_21;
  half_btf_0_sse4_1((__m128i *)&local_8f8,(__m128i *)&local_e78,(__m128i *)&local_868,local_834);
  local_de8 = local_df8;
  lStack_de0 = lStack_df0;
  local_dd8 = local_dc8;
  lStack_dd0 = lStack_dc0;
  local_da8 = local_db8;
  lStack_da0 = lStack_db0;
  local_d98 = local_d88;
  lStack_d90 = lStack_d80;
  local_d68 = local_d78;
  lStack_d60 = lStack_d70;
  local_d58 = local_d48;
  lStack_d50 = lStack_d40;
  local_d28 = local_d38;
  lStack_d20 = lStack_d30;
  local_d18 = local_d08;
  lStack_d10 = lStack_d00;
  local_ce8 = local_cf8;
  lStack_ce0 = lStack_cf0;
  local_cd8 = local_cc8;
  lStack_cd0 = lStack_cc0;
  local_ca8 = local_cb8;
  lStack_ca0 = lStack_cb0;
  local_c98 = local_c88;
  lStack_c90 = lStack_c80;
  local_c68 = local_c78;
  lStack_c60 = lStack_c70;
  local_c58 = local_c48;
  lStack_c50 = lStack_c40;
  local_c28 = local_c38;
  lStack_c20 = lStack_c30;
  local_c18 = local_c08;
  lStack_c10 = lStack_c00;
  local_e78 = extraout_XMM0_Qa_22;
  lStack_e70 = extraout_XMM0_Qb_22;
  half_btf_0_sse4_1((__m128i *)&local_8d8,(__m128i *)&local_f78,(__m128i *)&local_868,local_834);
  local_f08 = extraout_XMM0_Qa_23;
  lStack_f00 = extraout_XMM0_Qb_23;
  half_btf_0_sse4_1((__m128i *)&local_a88,(__m128i *)&local_f78,(__m128i *)&local_868,local_834);
  local_f78 = extraout_XMM0_Qa_24;
  lStack_f70 = extraout_XMM0_Qb_24;
  half_btf_0_sse4_1((__m128i *)&local_b98,(__m128i *)&local_f38,(__m128i *)&local_868,local_834);
  local_f48 = extraout_XMM0_Qa_25;
  lStack_f40 = extraout_XMM0_Qb_25;
  half_btf_0_sse4_1((__m128i *)&local_958,(__m128i *)&local_f38,(__m128i *)&local_868,local_834);
  local_ee8 = local_ef8;
  lStack_ee0 = lStack_ef0;
  local_ed8 = local_ec8;
  lStack_ed0 = lStack_ec0;
  local_ea8 = local_eb8;
  lStack_ea0 = lStack_eb0;
  local_e98 = local_e88;
  lStack_e90 = lStack_e80;
  local_e68 = local_e78;
  lStack_e60 = lStack_e70;
  local_e58 = local_e48;
  lStack_e50 = lStack_e40;
  local_e28 = local_e38;
  lStack_e20 = lStack_e30;
  local_e18 = local_e08;
  lStack_e10 = lStack_e00;
  local_f38 = extraout_XMM0_Qa_26;
  lStack_f30 = extraout_XMM0_Qb_26;
  half_btf_sse4_1((__m128i *)&local_ab8,(__m128i *)&local_de8,(__m128i *)&local_a88,
                  (__m128i *)&local_c18,(__m128i *)&local_868,local_834);
  half_btf_sse4_1((__m128i *)&local_be8,(__m128i *)&local_dd8,(__m128i *)&local_ab8,
                  (__m128i *)&local_c28,(__m128i *)&local_868,local_834);
  half_btf_sse4_1((__m128i *)&local_b38,(__m128i *)&local_da8,(__m128i *)&local_9c8,
                  (__m128i *)&local_c58,(__m128i *)&local_868,local_834);
  half_btf_sse4_1((__m128i *)&local_b18,(__m128i *)&local_d98,(__m128i *)&local_b38,
                  (__m128i *)&local_c68,(__m128i *)&local_868,local_834);
  half_btf_sse4_1((__m128i *)&local_b38,(__m128i *)&local_d98,(__m128i *)&local_9c8,
                  (__m128i *)&local_c68,(__m128i *)&local_868,local_834);
  half_btf_sse4_1((__m128i *)&local_9c8,(__m128i *)&local_da8,(__m128i *)&local_9e8,
                  (__m128i *)&local_c58,(__m128i *)&local_868,local_834);
  half_btf_sse4_1((__m128i *)&local_ab8,(__m128i *)&local_dd8,(__m128i *)&local_a88,
                  (__m128i *)&local_c28,(__m128i *)&local_868,local_834);
  half_btf_sse4_1((__m128i *)&local_a88,(__m128i *)&local_de8,(__m128i *)&local_8d8,
                  (__m128i *)&local_c18,(__m128i *)&local_868,local_834);
  half_btf_sse4_1((__m128i *)&local_af8,(__m128i *)&local_d68,(__m128i *)&local_a08,
                  (__m128i *)&local_c98,(__m128i *)&local_868,local_834);
  half_btf_sse4_1((__m128i *)&local_b58,(__m128i *)&local_d58,(__m128i *)&local_af8,
                  (__m128i *)&local_ca8,(__m128i *)&local_868,local_834);
  half_btf_sse4_1((__m128i *)&local_b98,(__m128i *)&local_d28,(__m128i *)&local_958,
                  (__m128i *)&local_cd8,(__m128i *)&local_868,local_834);
  half_btf_sse4_1((__m128i *)&local_ad8,(__m128i *)&local_d18,(__m128i *)&local_b98,
                  (__m128i *)&local_ce8,(__m128i *)&local_868,local_834);
  half_btf_sse4_1((__m128i *)&local_b98,(__m128i *)&local_d18,(__m128i *)&local_958,
                  (__m128i *)&local_ce8,(__m128i *)&local_868,local_834);
  half_btf_sse4_1((__m128i *)&local_958,(__m128i *)&local_d28,(__m128i *)&local_a38,
                  (__m128i *)&local_cd8,(__m128i *)&local_868,local_834);
  half_btf_sse4_1((__m128i *)&local_af8,(__m128i *)&local_d58,(__m128i *)&local_a08,
                  (__m128i *)&local_ca8,(__m128i *)&local_868,local_834);
  half_btf_sse4_1((__m128i *)&local_a08,(__m128i *)&local_d68,(__m128i *)&local_9a8,
                  (__m128i *)&local_c98,(__m128i *)&local_868,local_834);
  half_btf_0_sse4_1((__m128i *)&local_918,(__m128i *)&local_fb8,(__m128i *)&local_868,local_834);
  local_f88 = extraout_XMM0_Qa_27;
  lStack_f80 = extraout_XMM0_Qb_27;
  half_btf_0_sse4_1((__m128i *)&local_a68,(__m128i *)&local_fb8,(__m128i *)&local_868,local_834);
  local_f68 = local_f78;
  lStack_f60 = lStack_f70;
  local_f58 = local_f48;
  lStack_f50 = lStack_f40;
  local_f28 = local_f38;
  lStack_f20 = lStack_f30;
  local_f18 = local_f08;
  lStack_f10 = lStack_f00;
  local_fb8 = extraout_XMM0_Qa_28;
  clamp_hi_01 = extraout_XMM0_Qb_28;
  half_btf_sse4_1((__m128i *)&local_ac8,(__m128i *)&local_ee8,(__m128i *)&local_a68,
                  (__m128i *)&local_e18,(__m128i *)&local_868,local_834);
  half_btf_sse4_1((__m128i *)&local_bb8,(__m128i *)&local_ed8,(__m128i *)&local_ac8,
                  (__m128i *)&local_e28,(__m128i *)&local_868,local_834);
  half_btf_sse4_1((__m128i *)&local_b48,(__m128i *)&local_ea8,(__m128i *)&local_9b8,
                  (__m128i *)&local_e58,(__m128i *)&local_868,local_834);
  half_btf_sse4_1((__m128i *)&local_b08,(__m128i *)&local_e98,(__m128i *)&local_b48,
                  (__m128i *)&local_e68,(__m128i *)&local_868,local_834);
  half_btf_sse4_1((__m128i *)&local_b48,(__m128i *)&local_e98,(__m128i *)&local_9b8,
                  (__m128i *)&local_e68,(__m128i *)&local_868,local_834);
  half_btf_sse4_1((__m128i *)&local_9b8,(__m128i *)&local_ea8,(__m128i *)&local_9f8,
                  (__m128i *)&local_e58,(__m128i *)&local_868,local_834);
  half_btf_sse4_1((__m128i *)&local_ac8,(__m128i *)&local_ed8,(__m128i *)&local_a68,
                  (__m128i *)&local_e28,(__m128i *)&local_868,local_834);
  palVar3 = (__m128i *)(ulong)local_834;
  palVar2 = (__m128i *)&local_868;
  half_btf_sse4_1((__m128i *)&local_a68,(__m128i *)&local_ee8,(__m128i *)&local_918,
                  (__m128i *)&local_e18,palVar2,local_834);
  for (local_844 = 0x20; (int)local_844 < 0x40; local_844 = local_844 + 8) {
    in0[0] = &stack0xfffffffffffff008 + (long)(int)local_844 * 0x10;
    in0[1] = &stack0xfffffffffffff008 + (long)(int)(local_844 + 3) * 0x10;
    in1[1] = (longlong)&local_898;
    in1[0] = (longlong)&local_888;
    addsub_sse4_1(in0,in1,palVar2,palVar3,in_stack_ffffffffffffef98,in_stack_ffffffffffffefa0);
    in0_00[0] = &stack0xfffffffffffff008 + (long)(int)(local_844 + 1) * 0x10;
    in0_00[1] = &stack0xfffffffffffff008 + (long)(int)(local_844 + 2) * 0x10;
    in1_00[1] = (longlong)&local_898;
    in1_00[0] = (longlong)&local_888;
    addsub_sse4_1(in0_00,in1_00,palVar2,palVar3,in_stack_ffffffffffffef98,in_stack_ffffffffffffefa0)
    ;
    in0_01[0] = &stack0xfffffffffffff008 + (long)(int)(local_844 + 7) * 0x10;
    in0_01[1] = &stack0xfffffffffffff008 + (long)(int)(local_844 + 4) * 0x10;
    in1_01[1] = (longlong)&local_898;
    in1_01[0] = (longlong)&local_888;
    addsub_sse4_1(in0_01,in1_01,palVar2,palVar3,in_stack_ffffffffffffef98,in_stack_ffffffffffffefa0)
    ;
    in0_02[0] = &stack0xfffffffffffff008 + (long)(int)(local_844 + 6) * 0x10;
    in0_02[1] = &stack0xfffffffffffff008 + (long)(int)(local_844 + 5) * 0x10;
    in1_02[1] = (longlong)&local_898;
    in1_02[0] = (longlong)&local_888;
    addsub_sse4_1(in0_02,in1_02,palVar2,palVar3,in_stack_ffffffffffffef98,in_stack_ffffffffffffefa0)
    ;
  }
  half_btf_0_sse4_1((__m128i *)&local_9d8,(__m128i *)&stack0xfffffffffffff008,(__m128i *)&local_868,
                    local_834);
  palVar3 = extraout_XMM0_Qa_29;
  cospim48_00 = extraout_XMM0_Qb_29;
  half_btf_0_sse4_1((__m128i *)&local_9d8,(__m128i *)&stack0xfffffffffffff008,(__m128i *)&local_868,
                    local_834);
  local_fa8[0] = local_fb8;
  local_f98 = local_f88;
  lStack_f90 = lStack_f80;
  clamp_lo_00 = extraout_XMM0_Qa_30;
  clamp_hi_00 = extraout_XMM0_Qb_30;
  half_btf_sse4_1((__m128i *)&local_ae8,(__m128i *)&local_f68,(__m128i *)&local_a18,
                  (__m128i *)&local_f18,(__m128i *)&local_868,local_834);
  half_btf_sse4_1((__m128i *)&local_a18,(__m128i *)&local_f68,(__m128i *)&local_998,
                  (__m128i *)&local_f18,(__m128i *)&local_868,local_834);
  half_btf_sse4_1((__m128i *)&local_b68,(__m128i *)&local_f58,(__m128i *)&local_ae8,
                  (__m128i *)&local_f28,(__m128i *)&local_868,local_834);
  palVar4 = (__m128i *)(ulong)local_834;
  palVar2 = (__m128i *)&local_868;
  half_btf_sse4_1((__m128i *)&local_ae8,(__m128i *)&local_f58,(__m128i *)&local_a18,
                  (__m128i *)&local_f28,palVar2,local_834);
  for (local_844 = 0x10; (int)local_844 < 0x20; local_844 = local_844 + 8) {
    in0_03[0] = &stack0xfffffffffffff008 + (long)(int)local_844 * 0x10;
    in0_03[1] = &stack0xfffffffffffff008 + (long)(int)(local_844 + 3) * 0x10;
    in1_03[1] = (longlong)&local_898;
    in1_03[0] = (longlong)&local_888;
    addsub_sse4_1(in0_03,in1_03,palVar2,palVar4,in_stack_ffffffffffffef98,in_stack_ffffffffffffefa0)
    ;
    in0_04[0] = &stack0xfffffffffffff008 + (long)(int)(local_844 + 1) * 0x10;
    in0_04[1] = &stack0xfffffffffffff008 + (long)(int)(local_844 + 2) * 0x10;
    in1_04[1] = (longlong)&local_898;
    in1_04[0] = (longlong)&local_888;
    addsub_sse4_1(in0_04,in1_04,palVar2,palVar4,in_stack_ffffffffffffef98,in_stack_ffffffffffffefa0)
    ;
    in0_05[0] = &stack0xfffffffffffff008 + (long)(int)(local_844 + 7) * 0x10;
    in0_05[1] = &stack0xfffffffffffff008 + (long)(int)(local_844 + 4) * 0x10;
    in1_05[1] = (longlong)&local_898;
    in1_05[0] = (longlong)&local_888;
    addsub_sse4_1(in0_05,in1_05,palVar2,palVar4,in_stack_ffffffffffffef98,in_stack_ffffffffffffefa0)
    ;
    in0_06[0] = &stack0xfffffffffffff008 + (long)(int)(local_844 + 6) * 0x10;
    in0_06[1] = &stack0xfffffffffffff008 + (long)(int)(local_844 + 5) * 0x10;
    in1_06[1] = (longlong)&local_898;
    in1_06[0] = (longlong)&local_888;
    addsub_sse4_1(in0_06,in1_06,palVar2,palVar4,in_stack_ffffffffffffef98,in_stack_ffffffffffffefa0)
    ;
  }
  half_btf_sse4_1((__m128i *)&local_ac8,(__m128i *)&local_dd8,(__m128i *)&local_a68,
                  (__m128i *)&local_c28,(__m128i *)&local_868,local_834);
  half_btf_sse4_1((__m128i *)&local_ac8,(__m128i *)&local_dc8,(__m128i *)&local_a68,
                  (__m128i *)&local_c38,(__m128i *)&local_868,local_834);
  half_btf_sse4_1((__m128i *)&local_bb8,(__m128i *)&local_db8,(__m128i *)&local_ac8,
                  (__m128i *)&local_c48,(__m128i *)&local_868,local_834);
  half_btf_sse4_1((__m128i *)&local_bb8,(__m128i *)&local_da8,(__m128i *)&local_ac8,
                  (__m128i *)&local_c58,(__m128i *)&local_868,local_834);
  half_btf_sse4_1((__m128i *)&local_ac8,(__m128i *)&local_da8,(__m128i *)&local_a68,
                  (__m128i *)&local_c58,(__m128i *)&local_868,local_834);
  half_btf_sse4_1((__m128i *)&local_ac8,(__m128i *)&local_db8,(__m128i *)&local_a68,
                  (__m128i *)&local_c48,(__m128i *)&local_868,local_834);
  half_btf_sse4_1((__m128i *)&local_a68,(__m128i *)&local_dc8,(__m128i *)&local_918,
                  (__m128i *)&local_c38,(__m128i *)&local_868,local_834);
  half_btf_sse4_1((__m128i *)&local_a68,(__m128i *)&local_dd8,(__m128i *)&local_918,
                  (__m128i *)&local_c28,(__m128i *)&local_868,local_834);
  half_btf_sse4_1((__m128i *)&local_b48,(__m128i *)&local_d58,(__m128i *)&local_9b8,
                  (__m128i *)&local_ca8,(__m128i *)&local_868,local_834);
  half_btf_sse4_1((__m128i *)&local_b48,(__m128i *)&local_d48,(__m128i *)&local_9b8,
                  (__m128i *)&local_cb8,(__m128i *)&local_868,local_834);
  half_btf_sse4_1((__m128i *)&local_b08,(__m128i *)&local_d38,(__m128i *)&local_b48,
                  (__m128i *)&local_cc8,(__m128i *)&local_868,local_834);
  half_btf_sse4_1((__m128i *)&local_b08,(__m128i *)&local_d28,(__m128i *)&local_b48,
                  (__m128i *)&local_cd8,(__m128i *)&local_868,local_834);
  half_btf_sse4_1((__m128i *)&local_b48,(__m128i *)&local_d28,(__m128i *)&local_9b8,
                  (__m128i *)&local_cd8,(__m128i *)&local_868,local_834);
  half_btf_sse4_1((__m128i *)&local_b48,(__m128i *)&local_d38,(__m128i *)&local_9b8,
                  (__m128i *)&local_cc8,(__m128i *)&local_868,local_834);
  half_btf_sse4_1((__m128i *)&local_9b8,(__m128i *)&local_d48,(__m128i *)&local_9f8,
                  (__m128i *)&local_cb8,(__m128i *)&local_868,local_834);
  half_btf_sse4_1((__m128i *)&local_9b8,(__m128i *)&local_d58,(__m128i *)&local_9f8,
                  (__m128i *)&local_ca8,(__m128i *)&local_868,local_834);
  rnding_00 = clamp_lo_00;
  palVar5 = clamp_hi_00;
  half_btf_sse4_1((__m128i *)&local_b28,&local_fa8,(__m128i *)&local_9d8,(__m128i *)&local_f98,
                  (__m128i *)&local_868,local_834);
  palVar4 = (__m128i *)(ulong)local_834;
  palVar2 = (__m128i *)&local_868;
  half_btf_sse4_1((__m128i *)&local_9d8,&local_fa8,(__m128i *)&local_9d8,(__m128i *)&local_f98,
                  palVar2,local_834);
  in0_07[0] = &local_f78;
  in0_07[1] = &local_f48;
  in1_07[1] = (longlong)&local_898;
  in1_07[0] = (longlong)&local_888;
  addsub_sse4_1(in0_07,in1_07,palVar2,palVar4,in_stack_ffffffffffffef98,in_stack_ffffffffffffefa0);
  in0_08[0] = &local_f68;
  in0_08[1] = &local_f58;
  in1_08[1] = (longlong)&local_898;
  in1_08[0] = (longlong)&local_888;
  addsub_sse4_1(in0_08,in1_08,palVar2,palVar4,in_stack_ffffffffffffef98,in_stack_ffffffffffffefa0);
  in0_09[0] = &local_f08;
  in0_09[1] = &local_f38;
  in1_09[1] = (longlong)&local_898;
  in1_09[0] = (longlong)&local_888;
  addsub_sse4_1(in0_09,in1_09,palVar2,palVar4,in_stack_ffffffffffffef98,in_stack_ffffffffffffefa0);
  in0_10[0] = &local_f18;
  in0_10[1] = &local_f28;
  in1_10[1] = (longlong)&local_898;
  in1_10[0] = (longlong)&local_888;
  addsub_sse4_1(in0_10,in1_10,palVar2,palVar4,in_stack_ffffffffffffef98,in_stack_ffffffffffffefa0);
  half_btf_sse4_1((__m128i *)&local_ae8,(__m128i *)&local_ed8,(__m128i *)&local_a18,
                  (__m128i *)&local_e28,(__m128i *)&local_868,local_834);
  cospim32_00 = extraout_XMM0_Qa_31;
  u_00 = extraout_XMM0_Qb_31;
  half_btf_sse4_1((__m128i *)&local_ae8,(__m128i *)&local_ec8,(__m128i *)&local_a18,
                  (__m128i *)&local_e38,(__m128i *)&local_868,local_834);
  cospim16_00 = extraout_XMM0_Qa_32;
  cospi32_00 = extraout_XMM0_Qb_32;
  half_btf_sse4_1((__m128i *)&local_b68,(__m128i *)&local_eb8,(__m128i *)&local_ae8,
                  (__m128i *)&local_e48,(__m128i *)&local_868,local_834);
  cospi16_00 = extraout_XMM0_Qa_33;
  cospi48_00 = extraout_XMM0_Qb_33;
  half_btf_sse4_1((__m128i *)&local_b68,(__m128i *)&local_ea8,(__m128i *)&local_ae8,
                  (__m128i *)&local_e58,(__m128i *)&local_868,local_834);
  palVar4 = extraout_XMM0_Qb_34;
  half_btf_sse4_1((__m128i *)&local_ae8,(__m128i *)&local_ea8,(__m128i *)&local_a18,
                  (__m128i *)&local_e58,(__m128i *)&local_868,local_834);
  half_btf_sse4_1((__m128i *)&local_ae8,(__m128i *)&local_eb8,(__m128i *)&local_a18,
                  (__m128i *)&local_e48,(__m128i *)&local_868,local_834);
  half_btf_sse4_1((__m128i *)&local_a18,(__m128i *)&local_ec8,(__m128i *)&local_998,
                  (__m128i *)&local_e38,(__m128i *)&local_868,local_834);
  out1 = (__m128i *)(ulong)local_834;
  palVar2 = (__m128i *)&local_868;
  half_btf_sse4_1((__m128i *)&local_a18,(__m128i *)&local_ed8,(__m128i *)&local_998,
                  (__m128i *)&local_e28,palVar2,local_834);
  for (local_844 = 0x20; (int)local_844 < 0x40; local_844 = local_844 + 0x10) {
    for (local_848 = local_844; (int)local_848 < (int)(local_844 + 4); local_848 = local_848 + 1) {
      in0_11[0] = &stack0xfffffffffffff008 + (long)(int)local_848 * 0x10;
      in0_11[1] = &stack0xfffffffffffff008 + (long)(int)(local_848 ^ 7) * 0x10;
      in1_11[1] = (longlong)&local_898;
      in1_11[0] = (longlong)&local_888;
      addsub_sse4_1(in0_11,in1_11,palVar2,out1,in_stack_ffffffffffffef98,in_stack_ffffffffffffefa0);
      in0_12[0] = &stack0xfffffffffffff008 + (long)(int)(local_848 ^ 0xf) * 0x10;
      in0_12[1] = &stack0xfffffffffffff008 + (long)(int)(local_848 ^ 8) * 0x10;
      in1_12[1] = (longlong)&local_898;
      in1_12[0] = (longlong)&local_888;
      addsub_sse4_1(in0_12,in1_12,palVar2,out1,in_stack_ffffffffffffef98,in_stack_ffffffffffffefa0);
    }
  }
  for (local_844 = 0; (int)local_844 < 4; local_844 = local_844 + 1) {
    in0_13[0] = &stack0xfffffffffffff008 + (long)(int)local_844 * 0x10;
    in0_13[1] = &stack0xfffffffffffff008 + (long)(int)(7 - local_844) * 0x10;
    in1_13[1] = (longlong)&local_898;
    in1_13[0] = (longlong)&local_888;
    addsub_sse4_1(in0_13,in1_13,palVar2,out1,in_stack_ffffffffffffef98,in_stack_ffffffffffffefa0);
  }
  idct64_stage8_sse4_1
            (u_00,cospim32_00,cospi32_00,cospim16_00,cospi48_00,cospi16_00,cospim48_00,clamp_lo_00,
             clamp_hi_00,rnding_00,(int)palVar5);
  bit_00 = (int)clamp_hi_00;
  idct64_stage9_sse4_1
            (u_00,cospim32_00,cospi32_00,cospim16_00,cospi48_00,cospi16_00,(int)cospim48_00);
  iVar1 = (int)((ulong)cospi16_00 >> 0x20);
  idct64_stage10_sse4_1(cospim48_00,palVar3,u_00,cospim32_00,cospi32_00,cospim16_00,bit_00);
  idct64_stage11_sse4_1
            (cospi32_00,cospim16_00,(int)((ulong)cospi48_00 >> 0x20),(int)cospi48_00,iVar1,palVar4,
             clamp_hi_01);
  return;
}

Assistant:

static void idct64x64_low16_sse4_1(__m128i *in, __m128i *out, int bit,
                                   int do_cols, int bd, int out_shift) {
  int i, j;
  const int32_t *cospi = cospi_arr(bit);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);

  const __m128i cospi1 = _mm_set1_epi32(cospi[1]);
  const __m128i cospi2 = _mm_set1_epi32(cospi[2]);
  const __m128i cospi3 = _mm_set1_epi32(cospi[3]);
  const __m128i cospi4 = _mm_set1_epi32(cospi[4]);
  const __m128i cospi5 = _mm_set1_epi32(cospi[5]);
  const __m128i cospi6 = _mm_set1_epi32(cospi[6]);
  const __m128i cospi7 = _mm_set1_epi32(cospi[7]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospi9 = _mm_set1_epi32(cospi[9]);
  const __m128i cospi10 = _mm_set1_epi32(cospi[10]);
  const __m128i cospi11 = _mm_set1_epi32(cospi[11]);
  const __m128i cospi12 = _mm_set1_epi32(cospi[12]);
  const __m128i cospi13 = _mm_set1_epi32(cospi[13]);
  const __m128i cospi14 = _mm_set1_epi32(cospi[14]);
  const __m128i cospi15 = _mm_set1_epi32(cospi[15]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospi20 = _mm_set1_epi32(cospi[20]);
  const __m128i cospi24 = _mm_set1_epi32(cospi[24]);
  const __m128i cospi28 = _mm_set1_epi32(cospi[28]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospi36 = _mm_set1_epi32(cospi[36]);
  const __m128i cospi40 = _mm_set1_epi32(cospi[40]);
  const __m128i cospi44 = _mm_set1_epi32(cospi[44]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospi51 = _mm_set1_epi32(cospi[51]);
  const __m128i cospi52 = _mm_set1_epi32(cospi[52]);
  const __m128i cospi54 = _mm_set1_epi32(cospi[54]);
  const __m128i cospi55 = _mm_set1_epi32(cospi[55]);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospi59 = _mm_set1_epi32(cospi[59]);
  const __m128i cospi60 = _mm_set1_epi32(cospi[60]);
  const __m128i cospi62 = _mm_set1_epi32(cospi[62]);
  const __m128i cospi63 = _mm_set1_epi32(cospi[63]);

  const __m128i cospim4 = _mm_set1_epi32(-cospi[4]);
  const __m128i cospim8 = _mm_set1_epi32(-cospi[8]);
  const __m128i cospim12 = _mm_set1_epi32(-cospi[12]);
  const __m128i cospim16 = _mm_set1_epi32(-cospi[16]);
  const __m128i cospim20 = _mm_set1_epi32(-cospi[20]);
  const __m128i cospim24 = _mm_set1_epi32(-cospi[24]);
  const __m128i cospim28 = _mm_set1_epi32(-cospi[28]);
  const __m128i cospim32 = _mm_set1_epi32(-cospi[32]);
  const __m128i cospim36 = _mm_set1_epi32(-cospi[36]);
  const __m128i cospim40 = _mm_set1_epi32(-cospi[40]);
  const __m128i cospim44 = _mm_set1_epi32(-cospi[44]);
  const __m128i cospim48 = _mm_set1_epi32(-cospi[48]);
  const __m128i cospim49 = _mm_set1_epi32(-cospi[49]);
  const __m128i cospim50 = _mm_set1_epi32(-cospi[50]);
  const __m128i cospim52 = _mm_set1_epi32(-cospi[52]);
  const __m128i cospim53 = _mm_set1_epi32(-cospi[53]);
  const __m128i cospim56 = _mm_set1_epi32(-cospi[56]);
  const __m128i cospim57 = _mm_set1_epi32(-cospi[57]);
  const __m128i cospim58 = _mm_set1_epi32(-cospi[58]);
  const __m128i cospim60 = _mm_set1_epi32(-cospi[60]);
  const __m128i cospim61 = _mm_set1_epi32(-cospi[61]);

  {
    __m128i u[64];
    __m128i tmp1, tmp2, tmp3, tmp4;
    // stage 1
    u[0] = in[0];
    u[32] = in[1];
    u[36] = in[9];
    u[40] = in[5];
    u[44] = in[13];
    u[48] = in[3];
    u[52] = in[11];
    u[56] = in[7];
    u[60] = in[15];
    u[16] = in[2];
    u[20] = in[10];
    u[24] = in[6];
    u[28] = in[14];
    u[4] = in[8];
    u[8] = in[4];
    u[12] = in[12];

    // stage 2
    u[63] = half_btf_0_sse4_1(&cospi1, &u[32], &rnding, bit);
    u[32] = half_btf_0_sse4_1(&cospi63, &u[32], &rnding, bit);
    u[35] = half_btf_0_sse4_1(&cospim49, &u[60], &rnding, bit);
    u[60] = half_btf_0_sse4_1(&cospi15, &u[60], &rnding, bit);
    u[59] = half_btf_0_sse4_1(&cospi9, &u[36], &rnding, bit);
    u[36] = half_btf_0_sse4_1(&cospi55, &u[36], &rnding, bit);
    u[39] = half_btf_0_sse4_1(&cospim57, &u[56], &rnding, bit);
    u[56] = half_btf_0_sse4_1(&cospi7, &u[56], &rnding, bit);
    u[55] = half_btf_0_sse4_1(&cospi5, &u[40], &rnding, bit);
    u[40] = half_btf_0_sse4_1(&cospi59, &u[40], &rnding, bit);
    u[43] = half_btf_0_sse4_1(&cospim53, &u[52], &rnding, bit);
    u[52] = half_btf_0_sse4_1(&cospi11, &u[52], &rnding, bit);
    u[47] = half_btf_0_sse4_1(&cospim61, &u[48], &rnding, bit);
    u[48] = half_btf_0_sse4_1(&cospi3, &u[48], &rnding, bit);
    u[51] = half_btf_0_sse4_1(&cospi13, &u[44], &rnding, bit);
    u[44] = half_btf_0_sse4_1(&cospi51, &u[44], &rnding, bit);

    // stage 3
    u[31] = half_btf_0_sse4_1(&cospi2, &u[16], &rnding, bit);
    u[16] = half_btf_0_sse4_1(&cospi62, &u[16], &rnding, bit);
    u[19] = half_btf_0_sse4_1(&cospim50, &u[28], &rnding, bit);
    u[28] = half_btf_0_sse4_1(&cospi14, &u[28], &rnding, bit);
    u[27] = half_btf_0_sse4_1(&cospi10, &u[20], &rnding, bit);
    u[20] = half_btf_0_sse4_1(&cospi54, &u[20], &rnding, bit);
    u[23] = half_btf_0_sse4_1(&cospim58, &u[24], &rnding, bit);
    u[24] = half_btf_0_sse4_1(&cospi6, &u[24], &rnding, bit);
    u[33] = u[32];
    u[34] = u[35];
    u[37] = u[36];
    u[38] = u[39];
    u[41] = u[40];
    u[42] = u[43];
    u[45] = u[44];
    u[46] = u[47];
    u[49] = u[48];
    u[50] = u[51];
    u[53] = u[52];
    u[54] = u[55];
    u[57] = u[56];
    u[58] = u[59];
    u[61] = u[60];
    u[62] = u[63];

    // stage 4
    u[15] = half_btf_0_sse4_1(&cospi4, &u[8], &rnding, bit);
    u[8] = half_btf_0_sse4_1(&cospi60, &u[8], &rnding, bit);
    u[11] = half_btf_0_sse4_1(&cospim52, &u[12], &rnding, bit);
    u[12] = half_btf_0_sse4_1(&cospi12, &u[12], &rnding, bit);

    u[17] = u[16];
    u[18] = u[19];
    u[21] = u[20];
    u[22] = u[23];
    u[25] = u[24];
    u[26] = u[27];
    u[29] = u[28];
    u[30] = u[31];

    tmp1 = half_btf_sse4_1(&cospim4, &u[33], &cospi60, &u[62], &rnding, bit);
    tmp2 = half_btf_sse4_1(&cospim60, &u[34], &cospim4, &u[61], &rnding, bit);
    tmp3 = half_btf_sse4_1(&cospim36, &u[37], &cospi28, &u[58], &rnding, bit);
    tmp4 = half_btf_sse4_1(&cospim28, &u[38], &cospim36, &u[57], &rnding, bit);
    u[57] = half_btf_sse4_1(&cospim36, &u[38], &cospi28, &u[57], &rnding, bit);
    u[58] = half_btf_sse4_1(&cospi28, &u[37], &cospi36, &u[58], &rnding, bit);
    u[61] = half_btf_sse4_1(&cospim4, &u[34], &cospi60, &u[61], &rnding, bit);
    u[62] = half_btf_sse4_1(&cospi60, &u[33], &cospi4, &u[62], &rnding, bit);
    u[33] = tmp1;
    u[34] = tmp2;
    u[37] = tmp3;
    u[38] = tmp4;

    tmp1 = half_btf_sse4_1(&cospim20, &u[41], &cospi44, &u[54], &rnding, bit);
    tmp2 = half_btf_sse4_1(&cospim44, &u[42], &cospim20, &u[53], &rnding, bit);
    tmp3 = half_btf_sse4_1(&cospim52, &u[45], &cospi12, &u[50], &rnding, bit);
    tmp4 = half_btf_sse4_1(&cospim12, &u[46], &cospim52, &u[49], &rnding, bit);
    u[49] = half_btf_sse4_1(&cospim52, &u[46], &cospi12, &u[49], &rnding, bit);
    u[50] = half_btf_sse4_1(&cospi12, &u[45], &cospi52, &u[50], &rnding, bit);
    u[53] = half_btf_sse4_1(&cospim20, &u[42], &cospi44, &u[53], &rnding, bit);
    u[54] = half_btf_sse4_1(&cospi44, &u[41], &cospi20, &u[54], &rnding, bit);
    u[41] = tmp1;
    u[42] = tmp2;
    u[45] = tmp3;
    u[46] = tmp4;

    // stage 5
    u[7] = half_btf_0_sse4_1(&cospi8, &u[4], &rnding, bit);
    u[4] = half_btf_0_sse4_1(&cospi56, &u[4], &rnding, bit);

    u[9] = u[8];
    u[10] = u[11];
    u[13] = u[12];
    u[14] = u[15];

    tmp1 = half_btf_sse4_1(&cospim8, &u[17], &cospi56, &u[30], &rnding, bit);
    tmp2 = half_btf_sse4_1(&cospim56, &u[18], &cospim8, &u[29], &rnding, bit);
    tmp3 = half_btf_sse4_1(&cospim40, &u[21], &cospi24, &u[26], &rnding, bit);
    tmp4 = half_btf_sse4_1(&cospim24, &u[22], &cospim40, &u[25], &rnding, bit);
    u[25] = half_btf_sse4_1(&cospim40, &u[22], &cospi24, &u[25], &rnding, bit);
    u[26] = half_btf_sse4_1(&cospi24, &u[21], &cospi40, &u[26], &rnding, bit);
    u[29] = half_btf_sse4_1(&cospim8, &u[18], &cospi56, &u[29], &rnding, bit);
    u[30] = half_btf_sse4_1(&cospi56, &u[17], &cospi8, &u[30], &rnding, bit);
    u[17] = tmp1;
    u[18] = tmp2;
    u[21] = tmp3;
    u[22] = tmp4;

    for (i = 32; i < 64; i += 8) {
      addsub_sse4_1(u[i + 0], u[i + 3], &u[i + 0], &u[i + 3], &clamp_lo,
                    &clamp_hi);
      addsub_sse4_1(u[i + 1], u[i + 2], &u[i + 1], &u[i + 2], &clamp_lo,
                    &clamp_hi);

      addsub_sse4_1(u[i + 7], u[i + 4], &u[i + 7], &u[i + 4], &clamp_lo,
                    &clamp_hi);
      addsub_sse4_1(u[i + 6], u[i + 5], &u[i + 6], &u[i + 5], &clamp_lo,
                    &clamp_hi);
    }

    // stage 6
    tmp1 = half_btf_0_sse4_1(&cospi32, &u[0], &rnding, bit);
    u[1] = half_btf_0_sse4_1(&cospi32, &u[0], &rnding, bit);
    u[0] = tmp1;
    u[5] = u[4];
    u[6] = u[7];

    tmp1 = half_btf_sse4_1(&cospim16, &u[9], &cospi48, &u[14], &rnding, bit);
    u[14] = half_btf_sse4_1(&cospi48, &u[9], &cospi16, &u[14], &rnding, bit);
    u[9] = tmp1;
    tmp2 = half_btf_sse4_1(&cospim48, &u[10], &cospim16, &u[13], &rnding, bit);
    u[13] = half_btf_sse4_1(&cospim16, &u[10], &cospi48, &u[13], &rnding, bit);
    u[10] = tmp2;

    for (i = 16; i < 32; i += 8) {
      addsub_sse4_1(u[i + 0], u[i + 3], &u[i + 0], &u[i + 3], &clamp_lo,
                    &clamp_hi);
      addsub_sse4_1(u[i + 1], u[i + 2], &u[i + 1], &u[i + 2], &clamp_lo,
                    &clamp_hi);

      addsub_sse4_1(u[i + 7], u[i + 4], &u[i + 7], &u[i + 4], &clamp_lo,
                    &clamp_hi);
      addsub_sse4_1(u[i + 6], u[i + 5], &u[i + 6], &u[i + 5], &clamp_lo,
                    &clamp_hi);
    }

    tmp1 = half_btf_sse4_1(&cospim8, &u[34], &cospi56, &u[61], &rnding, bit);
    tmp2 = half_btf_sse4_1(&cospim8, &u[35], &cospi56, &u[60], &rnding, bit);
    tmp3 = half_btf_sse4_1(&cospim56, &u[36], &cospim8, &u[59], &rnding, bit);
    tmp4 = half_btf_sse4_1(&cospim56, &u[37], &cospim8, &u[58], &rnding, bit);
    u[58] = half_btf_sse4_1(&cospim8, &u[37], &cospi56, &u[58], &rnding, bit);
    u[59] = half_btf_sse4_1(&cospim8, &u[36], &cospi56, &u[59], &rnding, bit);
    u[60] = half_btf_sse4_1(&cospi56, &u[35], &cospi8, &u[60], &rnding, bit);
    u[61] = half_btf_sse4_1(&cospi56, &u[34], &cospi8, &u[61], &rnding, bit);
    u[34] = tmp1;
    u[35] = tmp2;
    u[36] = tmp3;
    u[37] = tmp4;

    tmp1 = half_btf_sse4_1(&cospim40, &u[42], &cospi24, &u[53], &rnding, bit);
    tmp2 = half_btf_sse4_1(&cospim40, &u[43], &cospi24, &u[52], &rnding, bit);
    tmp3 = half_btf_sse4_1(&cospim24, &u[44], &cospim40, &u[51], &rnding, bit);
    tmp4 = half_btf_sse4_1(&cospim24, &u[45], &cospim40, &u[50], &rnding, bit);
    u[50] = half_btf_sse4_1(&cospim40, &u[45], &cospi24, &u[50], &rnding, bit);
    u[51] = half_btf_sse4_1(&cospim40, &u[44], &cospi24, &u[51], &rnding, bit);
    u[52] = half_btf_sse4_1(&cospi24, &u[43], &cospi40, &u[52], &rnding, bit);
    u[53] = half_btf_sse4_1(&cospi24, &u[42], &cospi40, &u[53], &rnding, bit);
    u[42] = tmp1;
    u[43] = tmp2;
    u[44] = tmp3;
    u[45] = tmp4;

    // stage 7
    u[3] = u[0];
    u[2] = u[1];
    tmp1 = half_btf_sse4_1(&cospim32, &u[5], &cospi32, &u[6], &rnding, bit);
    u[6] = half_btf_sse4_1(&cospi32, &u[5], &cospi32, &u[6], &rnding, bit);
    u[5] = tmp1;
    addsub_sse4_1(u[8], u[11], &u[8], &u[11], &clamp_lo, &clamp_hi);
    addsub_sse4_1(u[9], u[10], &u[9], &u[10], &clamp_lo, &clamp_hi);
    addsub_sse4_1(u[15], u[12], &u[15], &u[12], &clamp_lo, &clamp_hi);
    addsub_sse4_1(u[14], u[13], &u[14], &u[13], &clamp_lo, &clamp_hi);

    tmp1 = half_btf_sse4_1(&cospim16, &u[18], &cospi48, &u[29], &rnding, bit);
    tmp2 = half_btf_sse4_1(&cospim16, &u[19], &cospi48, &u[28], &rnding, bit);
    tmp3 = half_btf_sse4_1(&cospim48, &u[20], &cospim16, &u[27], &rnding, bit);
    tmp4 = half_btf_sse4_1(&cospim48, &u[21], &cospim16, &u[26], &rnding, bit);
    u[26] = half_btf_sse4_1(&cospim16, &u[21], &cospi48, &u[26], &rnding, bit);
    u[27] = half_btf_sse4_1(&cospim16, &u[20], &cospi48, &u[27], &rnding, bit);
    u[28] = half_btf_sse4_1(&cospi48, &u[19], &cospi16, &u[28], &rnding, bit);
    u[29] = half_btf_sse4_1(&cospi48, &u[18], &cospi16, &u[29], &rnding, bit);
    u[18] = tmp1;
    u[19] = tmp2;
    u[20] = tmp3;
    u[21] = tmp4;

    for (i = 32; i < 64; i += 16) {
      for (j = i; j < i + 4; j++) {
        addsub_sse4_1(u[j], u[j ^ 7], &u[j], &u[j ^ 7], &clamp_lo, &clamp_hi);
        addsub_sse4_1(u[j ^ 15], u[j ^ 8], &u[j ^ 15], &u[j ^ 8], &clamp_lo,
                      &clamp_hi);
      }
    }

    // stage 8
    for (i = 0; i < 4; ++i) {
      addsub_sse4_1(u[i], u[7 - i], &u[i], &u[7 - i], &clamp_lo, &clamp_hi);
    }

    idct64_stage8_sse4_1(u, &cospim32, &cospi32, &cospim16, &cospi48, &cospi16,
                         &cospim48, &clamp_lo, &clamp_hi, &rnding, bit);

    // stage 9
    idct64_stage9_sse4_1(u, &cospim32, &cospi32, &clamp_lo, &clamp_hi, &rnding,
                         bit);

    // stage 10
    idct64_stage10_sse4_1(u, &cospim32, &cospi32, &clamp_lo, &clamp_hi, &rnding,
                          bit);

    // stage 11
    idct64_stage11_sse4_1(u, out, do_cols, bd, out_shift, &clamp_lo, &clamp_hi);
  }
}